

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_extrakeys_ge_even_y(secp256k1_ge *r)

{
  int iVar1;
  long in_RDI;
  int y_parity;
  undefined4 local_c;
  
  iVar1 = secp256k1_fe_impl_is_odd((secp256k1_fe *)(in_RDI + 0x28));
  if (iVar1 != 0) {
    secp256k1_fe_impl_negate_unchecked
              ((secp256k1_fe *)(in_RDI + 0x28),(secp256k1_fe *)(in_RDI + 0x28),1);
  }
  local_c = (uint)(iVar1 != 0);
  return local_c;
}

Assistant:

static int secp256k1_extrakeys_ge_even_y(secp256k1_ge *r) {
    int y_parity = 0;
    VERIFY_CHECK(!secp256k1_ge_is_infinity(r));

    if (secp256k1_fe_is_odd(&r->y)) {
        secp256k1_fe_negate(&r->y, &r->y, 1);
        y_parity = 1;
    }
    return y_parity;
}